

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

int mbedtls_ecp_mul(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_mpi *m,mbedtls_ecp_point *P,
                   _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  mbedtls_mpi *pmVar1;
  mbedtls_mpi *Y;
  mbedtls_mpi *pmVar2;
  byte *pbVar3;
  byte bVar4;
  size_t sVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  byte bVar10;
  byte bVar11;
  uchar swap;
  ulong uVar12;
  mbedtls_ecp_point *pmVar13;
  byte bVar14;
  ulong uVar15;
  size_t sVar16;
  byte bVar17;
  int iVar18;
  ulong t_len;
  mbedtls_ecp_point *P_00;
  long lVar19;
  ulong uVar20;
  mbedtls_ecp_point *R_00;
  bool bVar21;
  bool bVar22;
  byte local_2c0;
  mbedtls_ecp_point *local_298;
  mbedtls_mpi B;
  mbedtls_mpi E;
  mbedtls_mpi BB;
  mbedtls_mpi AA;
  mbedtls_mpi D;
  mbedtls_mpi local_1e0;
  mbedtls_mpi DA;
  mbedtls_mpi C;
  mbedtls_ecp_point RP;
  mbedtls_mpi A;
  mbedtls_mpi local_48;
  
  iVar6 = mbedtls_mpi_cmp_int(&P->Z,1);
  if (iVar6 != 0) {
    return -0x4f80;
  }
  iVar6 = mbedtls_ecp_check_privkey(grp,m);
  if (iVar6 != 0) {
    return iVar6;
  }
  iVar6 = mbedtls_ecp_check_pubkey(grp,P);
  if (iVar6 != 0) {
    return iVar6;
  }
  if ((grp->G).X.p == (mbedtls_mpi_uint *)0x0) {
    return 0;
  }
  if ((grp->G).Y.p == (mbedtls_mpi_uint *)0x0) {
    mbedtls_ecp_point_init(&RP);
    mbedtls_mpi_init(&local_48);
    iVar6 = mbedtls_mpi_copy(&local_48,&P->X);
    if (((iVar6 == 0) && (iVar6 = mbedtls_ecp_copy(&RP,P), iVar6 == 0)) &&
       (iVar6 = mbedtls_mpi_lset(&R->X,1), iVar6 == 0)) {
      pmVar1 = &R->Z;
      iVar6 = mbedtls_mpi_lset(pmVar1,0);
      if (iVar6 == 0) {
        mbedtls_mpi_free(&R->Y);
        Y = &grp->P;
        do {
          iVar6 = mbedtls_mpi_cmp_mpi(&RP.X,Y);
          if (iVar6 < 0) {
            if (f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) goto LAB_0012457a;
            sVar5 = grp->pbits;
            mbedtls_mpi_init(&A);
            iVar8 = 0;
            goto LAB_0012436f;
          }
          iVar6 = mbedtls_mpi_sub_abs(&RP.X,&RP.X,Y);
        } while (iVar6 == 0);
      }
    }
    goto LAB_00124451;
  }
  goto LAB_00123ea9;
joined_r0x001247b3:
  if (iVar6 != 0) goto LAB_001246a5;
  if ((-1 < B.s) || (iVar6 = mbedtls_mpi_cmp_int(&B,0), iVar6 == 0)) {
    iVar6 = mbedtls_mpi_mul_mpi(&BB,&B,&B);
    if ((iVar6 == 0) && (iVar6 = ecp_modp(&BB,grp), iVar6 == 0)) {
      mul_count = mul_count + 1;
      iVar6 = mbedtls_mpi_sub_mpi(&E,&AA,&BB);
      goto joined_r0x00124852;
    }
    goto LAB_001246a5;
  }
  iVar6 = mbedtls_mpi_add_mpi(&B,&B,Y);
  goto joined_r0x001247b3;
joined_r0x00124852:
  if (iVar6 != 0) goto LAB_001246a5;
  if ((-1 < E.s) || (iVar6 = mbedtls_mpi_cmp_int(&E,0), iVar6 == 0)) {
    iVar6 = mbedtls_mpi_add_mpi(&C,&RP.X,&RP.Z);
    goto joined_r0x001248b3;
  }
  iVar6 = mbedtls_mpi_add_mpi(&E,&E,Y);
  goto joined_r0x00124852;
joined_r0x001248b3:
  if (iVar6 != 0) goto LAB_001246a5;
  iVar6 = mbedtls_mpi_cmp_mpi(&C,Y);
  if (iVar6 < 0) {
    iVar6 = mbedtls_mpi_sub_mpi(&D,&RP.X,&RP.Z);
    goto joined_r0x00124929;
  }
  iVar6 = mbedtls_mpi_sub_abs(&C,&C,Y);
  goto joined_r0x001248b3;
joined_r0x00124929:
  if (iVar6 != 0) goto LAB_001246a5;
  if ((-1 < D.s) || (iVar6 = mbedtls_mpi_cmp_int(&D,0), iVar6 == 0)) {
    iVar6 = mbedtls_mpi_mul_mpi(&DA,&D,&A);
    if ((iVar6 == 0) && (iVar6 = ecp_modp(&DA,grp), iVar6 == 0)) {
      mul_count = mul_count + 1;
      iVar6 = mbedtls_mpi_mul_mpi(&local_1e0,&C,&B);
      if ((iVar6 == 0) && (iVar6 = ecp_modp(&local_1e0,grp), iVar6 == 0)) {
        mul_count = mul_count + 1;
        iVar6 = mbedtls_mpi_add_mpi(&RP.X,&DA,&local_1e0);
        if ((iVar6 == 0) && (iVar6 = ecp_modp(&RP.X,grp), iVar6 == 0)) {
          mul_count = mul_count + 1;
          iVar6 = mbedtls_mpi_mul_mpi(&RP.X,&RP.X,&RP.X);
          if ((iVar6 == 0) && (iVar6 = ecp_modp(&RP.X,grp), iVar6 == 0)) {
            mul_count = mul_count + 1;
            iVar6 = mbedtls_mpi_sub_mpi(&RP.Z,&DA,&local_1e0);
            goto joined_r0x00124a9a;
          }
        }
      }
    }
    goto LAB_001246a5;
  }
  iVar6 = mbedtls_mpi_add_mpi(&D,&D,Y);
  goto joined_r0x00124929;
joined_r0x00124a9a:
  if (iVar6 != 0) goto LAB_001246a5;
  if ((-1 < RP.Z.s) || (iVar6 = mbedtls_mpi_cmp_int(&RP.Z,0), iVar6 == 0)) {
    pmVar2 = &RP.Z;
    iVar6 = mbedtls_mpi_mul_mpi(pmVar2,pmVar2,pmVar2);
    if ((iVar6 == 0) && (iVar6 = ecp_modp(&RP.Z,grp), iVar6 == 0)) {
      mul_count = mul_count + 1;
      iVar6 = mbedtls_mpi_mul_mpi(&RP.Z,&local_48,&RP.Z);
      if ((iVar6 == 0) && (iVar6 = ecp_modp(&RP.Z,grp), iVar6 == 0)) {
        mul_count = mul_count + 1;
        iVar6 = mbedtls_mpi_mul_mpi(&R->X,&AA,&BB);
        if ((iVar6 == 0) && (iVar6 = ecp_modp(&R->X,grp), iVar6 == 0)) {
          mul_count = mul_count + 1;
          iVar6 = mbedtls_mpi_mul_mpi(pmVar1,&grp->A,&E);
          if ((iVar6 == 0) && (iVar6 = ecp_modp(pmVar1,grp), iVar6 == 0)) {
            mul_count = mul_count + 1;
            iVar6 = mbedtls_mpi_add_mpi(pmVar1,&BB,pmVar1);
            goto joined_r0x00124bf3;
          }
        }
      }
    }
    goto LAB_001246a5;
  }
  iVar6 = mbedtls_mpi_add_mpi(&RP.Z,&RP.Z,Y);
  goto joined_r0x00124a9a;
joined_r0x00124bf3:
  if (iVar6 != 0) goto LAB_001246a5;
  iVar6 = mbedtls_mpi_cmp_mpi(pmVar1,Y);
  if (iVar6 < 0) {
    iVar6 = mbedtls_mpi_mul_mpi(pmVar1,&E,pmVar1);
    if ((iVar6 == 0) && (iVar6 = ecp_modp(pmVar1,grp), iVar6 == 0)) {
      mul_count = mul_count + 1;
      iVar6 = 0;
    }
    goto LAB_001246a5;
  }
  iVar6 = mbedtls_mpi_sub_abs(pmVar1,pmVar1,Y);
  goto joined_r0x00124bf3;
  while( true ) {
    iVar8 = iVar8 + 1;
    iVar6 = mbedtls_mpi_cmp_int(&A,1);
    if (0 < iVar6) break;
LAB_0012436f:
    iVar6 = mbedtls_mpi_fill_random(&A,sVar5 + 7 >> 3,f_rng,p_rng);
    while( true ) {
      if (iVar6 != 0) goto LAB_00124431;
      iVar6 = mbedtls_mpi_cmp_mpi(&A,Y);
      if (iVar6 < 0) break;
      iVar6 = mbedtls_mpi_shift_r(&A,1);
    }
    if (iVar8 == 0xb) {
      iVar6 = -0x4d00;
      goto LAB_00124451;
    }
  }
  iVar6 = mbedtls_mpi_mul_mpi(&RP.X,&RP.X,&A);
  if ((iVar6 == 0) && (iVar6 = ecp_modp(&RP.X,grp), iVar6 == 0)) {
    mul_count = mul_count + 1;
    pmVar2 = &RP.Z;
    iVar6 = mbedtls_mpi_mul_mpi(pmVar2,pmVar2,&A);
    if ((iVar6 == 0) && (iVar6 = ecp_modp(pmVar2,grp), iVar6 == 0)) {
      mul_count = mul_count + 1;
      iVar6 = 0;
    }
  }
LAB_00124431:
  mbedtls_mpi_free(&A);
  if (iVar6 == 0) {
LAB_0012457a:
    local_298 = (mbedtls_ecp_point *)mbedtls_mpi_bitlen(m);
    while( true ) {
      bVar22 = local_298 == (mbedtls_ecp_point *)0x0;
      local_298 = (mbedtls_ecp_point *)((long)local_298 - 1);
      if (bVar22) break;
      iVar6 = mbedtls_mpi_get_bit(m,(size_t)local_298);
      swap = (uchar)iVar6;
      iVar6 = mbedtls_mpi_safe_cond_swap(&R->X,&RP.X,swap);
      if ((iVar6 != 0) || (iVar6 = mbedtls_mpi_safe_cond_swap(pmVar1,&RP.Z,swap), iVar6 != 0))
      goto LAB_00124451;
      mbedtls_mpi_init(&A);
      mbedtls_mpi_init(&AA);
      mbedtls_mpi_init(&B);
      mbedtls_mpi_init(&BB);
      mbedtls_mpi_init(&E);
      mbedtls_mpi_init(&C);
      mbedtls_mpi_init(&D);
      mbedtls_mpi_init(&DA);
      mbedtls_mpi_init(&local_1e0);
      iVar6 = mbedtls_mpi_add_mpi(&A,&R->X,pmVar1);
      while (iVar6 == 0) {
        iVar6 = mbedtls_mpi_cmp_mpi(&A,Y);
        if (iVar6 < 0) {
          iVar6 = mbedtls_mpi_mul_mpi(&AA,&A,&A);
          if ((iVar6 == 0) && (iVar6 = ecp_modp(&AA,grp), iVar6 == 0)) {
            mul_count = mul_count + 1;
            iVar6 = mbedtls_mpi_sub_mpi(&B,&R->X,pmVar1);
            goto joined_r0x001247b3;
          }
          break;
        }
        iVar6 = mbedtls_mpi_sub_abs(&A,&A,Y);
      }
LAB_001246a5:
      mbedtls_mpi_free(&A);
      mbedtls_mpi_free(&AA);
      mbedtls_mpi_free(&B);
      mbedtls_mpi_free(&BB);
      mbedtls_mpi_free(&E);
      mbedtls_mpi_free(&C);
      mbedtls_mpi_free(&D);
      mbedtls_mpi_free(&DA);
      mbedtls_mpi_free(&local_1e0);
      if (((iVar6 != 0) || (iVar6 = mbedtls_mpi_safe_cond_swap(&R->X,&RP.X,swap), iVar6 != 0)) ||
         (iVar6 = mbedtls_mpi_safe_cond_swap(pmVar1,&RP.Z,swap), iVar6 != 0)) goto LAB_00124451;
    }
    iVar6 = mbedtls_mpi_inv_mod(pmVar1,pmVar1,Y);
    if (((iVar6 == 0) && (iVar6 = mbedtls_mpi_mul_mpi(&R->X,&R->X,pmVar1), iVar6 == 0)) &&
       (iVar6 = ecp_modp(&R->X,grp), iVar6 == 0)) {
      mul_count = mul_count + 1;
      iVar6 = mbedtls_mpi_lset(pmVar1,1);
    }
  }
LAB_00124451:
  mbedtls_ecp_point_free(&RP);
  mbedtls_mpi_free(&local_48);
  if ((grp->G).X.p == (mbedtls_mpi_uint *)0x0) {
    return iVar6;
  }
  if ((grp->G).Y.p == (mbedtls_mpi_uint *)0x0) {
    return iVar6;
  }
LAB_00123ea9:
  mbedtls_mpi_init(&BB);
  mbedtls_mpi_init(&E);
  iVar6 = mbedtls_mpi_get_bit(&grp->N,0);
  if (iVar6 != 1) {
    return -0x4f80;
  }
  uVar9 = grp->nbits;
  iVar6 = mbedtls_mpi_cmp_mpi(&P->Y,&(grp->G).Y);
  if (iVar6 == 0) {
    iVar6 = mbedtls_mpi_cmp_mpi(&P->X,&(grp->G).X);
    bVar22 = iVar6 == 0;
  }
  else {
    bVar22 = false;
  }
  uVar9 = (ulong)(byte)((0x17f < uVar9 | 4U) + bVar22);
  uVar15 = 2;
  if (uVar9 < grp->nbits) {
    uVar15 = uVar9;
  }
  uVar7 = 1 << ((char)uVar15 - 1U & 0x1f);
  uVar9 = ((grp->nbits + uVar15) - 1) / uVar15;
  local_2c0 = (byte)uVar7;
  if ((bVar22 == false) || (local_298 = grp->T, local_298 == (mbedtls_ecp_point *)0x0)) {
    uVar20 = 1;
    local_298 = (mbedtls_ecp_point *)calloc((ulong)uVar7,0x48);
    if (local_298 == (mbedtls_ecp_point *)0x0) {
      iVar6 = -0x4d80;
      goto LAB_00124301;
    }
    iVar6 = mbedtls_ecp_copy(local_298,P);
    if (iVar6 == 0) {
      uVar12 = 0;
      while( true ) {
        uVar20 = uVar20 & 0xff;
        t_len = uVar12 & 0xff;
        if (uVar7 <= (uint)uVar20) break;
        pmVar13 = local_298 + uVar20;
        iVar6 = mbedtls_ecp_copy(pmVar13,local_298 + (uVar20 >> 1));
        lVar19 = uVar9 + 1;
        while( true ) {
          if (iVar6 != 0) goto LAB_001242c9;
          lVar19 = lVar19 + -1;
          if (lVar19 == 0) break;
          iVar6 = ecp_double_jac(grp,pmVar13,pmVar13);
        }
        uVar12 = (ulong)((int)t_len + 1);
        *(mbedtls_ecp_point **)(&RP.X.s + t_len * 2) = pmVar13;
        uVar20 = (ulong)((uint)uVar20 * 2);
      }
      iVar6 = ecp_normalize_jac_many(grp,(mbedtls_ecp_point **)&RP,t_len);
      if (iVar6 == 0) {
        bVar17 = 0;
        for (bVar11 = 1; bVar11 < local_2c0; bVar11 = bVar11 * '\x02') {
          uVar20 = (ulong)bVar11;
          pmVar13 = local_298 + uVar20;
          P_00 = local_298 + (uVar20 - 1);
          R_00 = local_298 + uVar20 * 2 + -1;
          while (bVar21 = uVar20 != 0, uVar20 = uVar20 - 1, bVar21) {
            iVar6 = ecp_add_mixed(grp,R_00,P_00,pmVar13);
            if (iVar6 != 0) goto LAB_001242c9;
            uVar12 = (ulong)bVar17;
            bVar17 = bVar17 + 1;
            *(mbedtls_ecp_point **)(&RP.X.s + uVar12 * 2) = R_00;
            P_00 = P_00 + -1;
            R_00 = R_00 + -1;
          }
        }
        iVar6 = ecp_normalize_jac_many(grp,(mbedtls_ecp_point **)&RP,(ulong)bVar17);
        if (iVar6 == 0) {
          if (bVar22 != false) {
            grp->T = local_298;
            grp->T_size = (ulong)uVar7;
          }
          goto LAB_00123fd0;
        }
      }
    }
  }
  else {
LAB_00123fd0:
    iVar8 = mbedtls_mpi_get_bit(m,0);
    iVar6 = mbedtls_mpi_copy(&BB,m);
    if ((iVar6 == 0) && (iVar6 = mbedtls_mpi_sub_mpi(&E,&grp->N,m), iVar6 == 0)) {
      iVar6 = mbedtls_mpi_safe_cond_assign(&BB,&E,iVar8 != 1);
      if (iVar6 == 0) {
        memset(&RP,0,uVar9 + 1);
        for (uVar20 = 0; uVar20 != uVar9; uVar20 = uVar20 + 1) {
          for (uVar12 = 0; uVar15 != uVar12; uVar12 = uVar12 + 1) {
            iVar6 = mbedtls_mpi_get_bit(&BB,uVar12 * uVar9 + uVar20);
            pbVar3 = (byte *)((long)&RP.X.s + uVar20);
            *pbVar3 = *pbVar3 | (byte)(iVar6 << ((byte)uVar12 & 0x1f));
          }
        }
        bVar11 = 0;
        for (sVar16 = 1; uVar9 + 1 != sVar16; sVar16 = sVar16 + 1) {
          bVar17 = *(byte *)((long)&C.p + sVar16 + 7);
          bVar4 = *(byte *)((long)&RP.X.s + sVar16);
          bVar14 = bVar4 ^ bVar11;
          bVar10 = (~bVar14 & 1) * bVar17;
          bVar11 = bVar10 & bVar14 | bVar4 & bVar11;
          *(byte *)((long)&RP.X.s + sVar16) = bVar14 ^ bVar10;
          *(byte *)((long)&C.p + sVar16 + 7) = ~bVar14 << 7 | bVar17;
        }
        mbedtls_ecp_point_init((mbedtls_ecp_point *)&A);
        iVar6 = ecp_select_comb(grp,R,local_298,local_2c0,*(uchar *)((long)&RP.X.s + uVar9));
        if (iVar6 == 0) {
          pmVar1 = &R->Z;
          iVar6 = mbedtls_mpi_lset(pmVar1,1);
          if (iVar6 == 0) {
            if (f_rng != (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
              sVar5 = grp->pbits;
              mbedtls_mpi_init(&AA);
              mbedtls_mpi_init(&B);
              iVar18 = 0;
              do {
                iVar6 = mbedtls_mpi_fill_random(&AA,sVar5 + 7 >> 3,f_rng,p_rng);
                while( true ) {
                  if (iVar6 != 0) goto LAB_00124e1d;
                  iVar6 = mbedtls_mpi_cmp_mpi(&AA,&grp->P);
                  if (iVar6 < 0) break;
                  iVar6 = mbedtls_mpi_shift_r(&AA,1);
                }
                if (iVar18 == 0xb) {
                  iVar6 = -0x4d00;
                  goto LAB_001242ad;
                }
                iVar18 = iVar18 + 1;
                iVar6 = mbedtls_mpi_cmp_int(&AA,1);
              } while (iVar6 < 1);
              iVar6 = mbedtls_mpi_mul_mpi(pmVar1,pmVar1,&AA);
              if ((iVar6 == 0) && (iVar6 = ecp_modp(pmVar1,grp), iVar6 == 0)) {
                mul_count = mul_count + 1;
                iVar6 = mbedtls_mpi_mul_mpi(&B,&AA,&AA);
                if ((iVar6 == 0) && (iVar6 = ecp_modp(&B,grp), iVar6 == 0)) {
                  mul_count = mul_count + 1;
                  iVar6 = mbedtls_mpi_mul_mpi(&R->X,&R->X,&B);
                  if ((iVar6 == 0) && (iVar6 = ecp_modp(&R->X,grp), iVar6 == 0)) {
                    mul_count = mul_count + 1;
                    iVar6 = mbedtls_mpi_mul_mpi(&B,&B,&AA);
                    if ((iVar6 == 0) && (iVar6 = ecp_modp(&B,grp), iVar6 == 0)) {
                      mul_count = mul_count + 1;
                      pmVar1 = &R->Y;
                      iVar6 = mbedtls_mpi_mul_mpi(pmVar1,pmVar1,&B);
                      if ((iVar6 == 0) && (iVar6 = ecp_modp(pmVar1,grp), iVar6 == 0)) {
                        mul_count = mul_count + 1;
                        iVar6 = 0;
                      }
                    }
                  }
                }
              }
LAB_00124e1d:
              mbedtls_mpi_free(&AA);
              mbedtls_mpi_free(&B);
              if (iVar6 != 0) goto LAB_001242ad;
            }
            while (uVar9 != 0) {
              iVar6 = ecp_double_jac(grp,R,R);
              if (((iVar6 != 0) ||
                  (iVar6 = ecp_select_comb(grp,(mbedtls_ecp_point *)&A,local_298,local_2c0,
                                           *(uchar *)((long)&C.p + uVar9 + 7)), iVar6 != 0)) ||
                 (iVar6 = ecp_add_mixed(grp,R,R,(mbedtls_ecp_point *)&A), uVar9 = uVar9 - 1,
                 iVar6 != 0)) goto LAB_001242ad;
            }
            iVar6 = 0;
          }
        }
LAB_001242ad:
        mbedtls_ecp_point_free((mbedtls_ecp_point *)&A);
        if ((iVar6 == 0) && (iVar6 = ecp_safe_invert_jac(grp,R,iVar8 != 1), iVar6 == 0)) {
          iVar6 = ecp_normalize_jac(grp,R);
        }
      }
    }
  }
LAB_001242c9:
  if (bVar22 == false) {
    for (lVar19 = 0; ((ulong)uVar7 & 0xff) * 0x48 - lVar19 != 0; lVar19 = lVar19 + 0x48) {
      mbedtls_ecp_point_free((mbedtls_ecp_point *)((long)&(local_298->X).s + lVar19));
    }
    free(local_298);
  }
LAB_00124301:
  mbedtls_mpi_free(&BB);
  mbedtls_mpi_free(&E);
  if (iVar6 == 0) {
    return 0;
  }
  mbedtls_ecp_point_free(R);
  return iVar6;
}

Assistant:

int mbedtls_ecp_mul( mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
             const mbedtls_mpi *m, const mbedtls_ecp_point *P,
             int (*f_rng)(void *, unsigned char *, size_t), void *p_rng )
{
    int ret = MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
#if defined(MBEDTLS_ECP_INTERNAL_ALT)
    char is_grp_capable = 0;
#endif

    /* Common sanity checks */
    if( mbedtls_mpi_cmp_int( &P->Z, 1 ) != 0 )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    if( ( ret = mbedtls_ecp_check_privkey( grp, m ) ) != 0 ||
        ( ret = mbedtls_ecp_check_pubkey( grp, P ) ) != 0 )
        return( ret );

#if defined(MBEDTLS_ECP_INTERNAL_ALT)
    if ( is_grp_capable = mbedtls_internal_ecp_grp_capable( grp )  )
    {
        MBEDTLS_MPI_CHK( mbedtls_internal_ecp_init( grp ) );
    }

#endif /* MBEDTLS_ECP_INTERNAL_ALT */
#if defined(ECP_MONTGOMERY)
    if( ecp_get_type( grp ) == ECP_TYPE_MONTGOMERY )
        ret = ecp_mul_mxz( grp, R, m, P, f_rng, p_rng );

#endif
#if defined(ECP_SHORTWEIERSTRASS)
    if( ecp_get_type( grp ) == ECP_TYPE_SHORT_WEIERSTRASS )
        ret = ecp_mul_comb( grp, R, m, P, f_rng, p_rng );

#endif
#if defined(MBEDTLS_ECP_INTERNAL_ALT)
cleanup:

    if ( is_grp_capable )
    {
        mbedtls_internal_ecp_free( grp );
    }

#endif /* MBEDTLS_ECP_INTERNAL_ALT */
    return( ret );
}